

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

bool __thiscall google::protobuf::FieldDescriptor::has_optional_keyword(FieldDescriptor *this)

{
  bool bVar1;
  OneofDescriptor *pOVar2;
  
  bVar1 = true;
  if ((this->field_0x1 & 2) == 0) {
    if (((this->file_->edition_ != EDITION_PROTO2) ||
        ((this->merged_features_->field_0)._impl_.field_presence_ == 3)) ||
       (bVar1 = is_repeated(this), bVar1)) {
      bVar1 = false;
    }
    else {
      pOVar2 = containing_oneof(this);
      bVar1 = pOVar2 == (OneofDescriptor *)0x0;
    }
  }
  return bVar1;
}

Assistant:

bool FieldDescriptor::has_optional_keyword() const {
  return proto3_optional_ ||
         (file()->edition() == Edition::EDITION_PROTO2 && !is_required() &&
          !is_repeated() && !containing_oneof());
}